

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitTryTable(PrintExpressionContents *this,TryTable *curr)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  char local_33 [3];
  
  poVar2 = this->o;
  Colors::outputColorCode(poVar2,"\x1b[35m");
  Colors::outputColorCode(poVar2,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"try_table",9);
  Colors::outputColorCode(poVar2,"\x1b[0m");
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.id) {
    local_33[0] = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33,1);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (curr->super_SpecificExpression<(wasm::Expression::Id)53>).super_Expression.type.
                   id;
    PrintSExpression::printBlockType(this->parent,(Signature)(auVar4 << 0x40));
  }
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    uVar7 = 1;
    uVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this->o," (",2);
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar6) {
LAB_00a32bc5:
        pcVar5 = 
        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
        ;
LAB_00a32bf1:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                      ,0xbc,pcVar5);
      }
      uVar3 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.usedElements;
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data[uVar6].
          super_IString.str._M_str != (char *)0x0) {
        if (uVar3 <= uVar6) {
LAB_00a32bdc:
          pcVar5 = 
          "T &ArenaVectorBase<ArenaVector<bool>, bool>::operator[](size_t) const [SubType = ArenaVector<bool>, T = bool]"
          ;
          goto LAB_00a32bf1;
        }
        poVar2 = this->o;
        bVar1 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar6];
        pcVar5 = "catch ";
        if (bVar1 != false) {
          pcVar5 = "catch_ref ";
        }
        Colors::outputColorCode(poVar2,"\x1b[35m");
        Colors::outputColorCode(poVar2,"\x1b[1m");
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,(ulong)bVar1 * 4 + 6);
        Colors::outputColorCode(poVar2,"\x1b[0m");
        if (uVar6 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                    usedElements) {
          Name::print((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      data + uVar6,this->o);
          local_33[2] = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33 + 2,1);
          goto LAB_00a32b73;
        }
        goto LAB_00a32bc5;
      }
      if (uVar3 <= uVar6) goto LAB_00a32bdc;
      poVar2 = this->o;
      bVar1 = (curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>.data[uVar6];
      pcVar5 = "catch_all ";
      if (bVar1 != false) {
        pcVar5 = "catch_all_ref ";
      }
      Colors::outputColorCode(poVar2,"\x1b[35m");
      Colors::outputColorCode(poVar2,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar5,(ulong)bVar1 * 4 + 10);
      Colors::outputColorCode(poVar2,"\x1b[0m");
LAB_00a32b73:
      if ((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar6) goto LAB_00a32bc5;
      Name::print((curr->catchDests).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data
                  + uVar6,this->o);
      local_33[1] = 0x29;
      std::__ostream_insert<char,std::char_traits<char>>(this->o,local_33 + 1,1);
      uVar6 = (ulong)uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar6 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     usedElements);
  }
  return;
}

Assistant:

void visitTryTable(TryTable* curr) {
    printMedium(o, "try_table");
    if (curr->type.isConcrete()) {
      o << ' ';
      printBlockType(Signature(Type::none, curr->type));
    }
    for (Index i = 0; i < curr->catchTags.size(); i++) {
      o << " (";
      if (curr->catchTags[i]) {
        printMedium(o, curr->catchRefs[i] ? "catch_ref " : "catch ");
        curr->catchTags[i].print(o);
        o << ' ';
      } else {
        printMedium(o, curr->catchRefs[i] ? "catch_all_ref " : "catch_all ");
      }
      curr->catchDests[i].print(o);
      o << ')';
    }
  }